

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O2

int ncnn::rnn(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint _w;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  int i;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  void *pvVar22;
  float fVar23;
  int local_e8;
  Mat gates;
  
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  _w = top_blob->w;
  Mat::Mat(&gates,_w,4,opt->workspace_allocator);
  local_e8 = -100;
  if ((gates.data != (void *)0x0) && ((long)gates.c * gates.cstep != 0)) {
    pvVar8 = bottom_blob->data;
    iVar4 = bottom_blob->w;
    sVar9 = bottom_blob->elemsize;
    pvVar10 = top_blob->data;
    iVar5 = top_blob->w;
    sVar11 = top_blob->elemsize;
    local_e8 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar20 = 0;
    if (0 < (int)_w) {
      uVar20 = (ulong)_w;
    }
    uVar17 = 0;
    if (0 < (int)uVar3) {
      uVar17 = uVar3;
    }
    for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
      uVar15 = ~uVar18 + uVar3;
      if (reverse == 0) {
        uVar15 = uVar18;
      }
      pvVar22 = weight_xc->data;
      iVar6 = weight_xc->w;
      pvVar21 = weight_hc->data;
      iVar7 = weight_hc->w;
      sVar12 = weight_hc->elemsize;
      pvVar13 = bias_c->data;
      sVar14 = weight_xc->elemsize;
      for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
        fVar23 = *(float *)((long)pvVar13 + uVar19 * 4);
        for (uVar16 = 0; uVar2 != uVar16; uVar16 = uVar16 + 1) {
          fVar23 = fVar23 + *(float *)((long)pvVar8 +
                                      uVar16 * 4 + (long)iVar4 * sVar9 * (long)(int)uVar15) *
                            *(float *)((long)pvVar22 + uVar16 * 4);
        }
        for (uVar16 = 0; _w != uVar16; uVar16 = uVar16 + 1) {
          fVar23 = fVar23 + *(float *)((long)hidden_state->data + uVar16 * 4) *
                            *(float *)((long)pvVar21 + uVar16 * 4);
        }
        fVar23 = tanhf(fVar23);
        *(float *)((long)gates.data + uVar19 * 4) = fVar23;
        pvVar22 = (void *)((long)pvVar22 + (long)iVar6 * sVar14);
        pvVar21 = (void *)((long)pvVar21 + (long)iVar7 * sVar12);
      }
      pvVar22 = hidden_state->data;
      for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
        uVar1 = *(undefined4 *)((long)gates.data + uVar19 * 4);
        *(undefined4 *)((long)pvVar22 + uVar19 * 4) = uVar1;
        *(undefined4 *)((long)pvVar10 + uVar19 * 4 + (long)(int)uVar15 * (long)iVar5 * sVar11) =
             uVar1;
      }
    }
  }
  Mat::~Mat(&gates);
  return local_e8;
}

Assistant:

static int rnn(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);

        for (int q = 0; q < num_output; q++)
        {
            const float* weight_xc_ptr = weight_xc.row(q);

            const float* weight_hc_ptr = weight_hc.row(q);

            float H = bias_c[q];

            for (int i = 0; i < size; i++)
            {
                H += weight_xc_ptr[i] * x[i];
            }

            for (int i = 0; i < num_output; i++)
            {
                H += weight_hc_ptr[i] * hidden_state[i];
            }

            H = tanh(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}